

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FourierMotzkin.hpp
# Opt level: O2

IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:344:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_FourierMotzkin_hpp:59:23),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_FourierMotzkin_hpp:60:23),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_FourierMotzkin_hpp:61:20),_Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
* Inferences::ALASCA::FourierMotzkinConf::Lhs::iter
            (IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:344:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_FourierMotzkin_hpp:59:23),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_FourierMotzkin_hpp:60:23),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_FourierMotzkin_hpp:61:20),_Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
             *__return_storage_ptr__,AlascaState *shared,Clause *cl)

{
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:344:20)>_>
  IStack_2f8;
  undefined1 local_240 [16];
  FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>
  local_230;
  undefined1 local_148 [24];
  FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>
  local_130 [2];
  
  Kernel::AlascaState::selectedSummands(&IStack_2f8,shared,cl,NOT_LEQ,NOT_LEQ,false);
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1}>(unsigned_int,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1},Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(auto:1)#1},Kernel::SelectedLiteral>,Kernel::AlascaState::selectedActivePositions(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1},Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,Kernel::SelectedUninterpretedEquality,Kernel::SelectedUninterpretedPredicate>>>>,Kernel::AlascaState::selectedSummands(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>>
  ::
  filter<Inferences::ALASCA::FourierMotzkinConf::Lhs::iter(Kernel::AlascaState&,Kernel::Clause*)::_lambda(auto:1_const&)_1_>
            (local_240,&IStack_2f8);
  Lib::
  IterTraits<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1}>(unsigned_int,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1},Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(auto:1)#1},Kernel::SelectedLiteral>,Kernel::AlascaState::selectedActivePositions(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1},Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,Kernel::SelectedUninterpretedEquality,Kernel::SelectedUninterpretedPredicate>>>>,Kernel::AlascaState::selectedSummands(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>,Inferences::ALASCA::FourierMotzkinConf::Lhs::iter(Kernel::AlascaState&,Kernel::Clause*)::{lambda(auto:1_const&)#1},false>>
  ::
  filter<Inferences::ALASCA::FourierMotzkinConf::Lhs::iter(Kernel::AlascaState&,Kernel::Clause*)::_lambda(auto:1_const&)_2_>
            (local_148,local_240);
  Lib::
  IterTraits<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1}>(unsigned_int,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1},Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(auto:1)#1},Kernel::SelectedLiteral>,Kernel::AlascaState::selectedActivePositions(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1},Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,Kernel::SelectedUninterpretedEquality,Kernel::SelectedUninterpretedPredicate>>>>,Kernel::AlascaState::selectedSummands(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>,Inferences::ALASCA::FourierMotzkinConf::Lhs::iter(Kernel::AlascaState&,Kernel::Clause*)::{lambda(auto:1_const&)#1},false>,Inferences::ALASCA::FourierMotzkinConf::Lhs::iter(Kernel::AlascaState&,Kernel::Clause*)::{lambda(auto:1_const&)#2},false>>
  ::
  map<Inferences::ALASCA::FourierMotzkinConf::Lhs::iter(Kernel::AlascaState&,Kernel::Clause*)::_lambda(auto:1)_1_>
            (__return_storage_ptr__,local_148);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>
  ::~FlatteningIterator(local_130);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>
  ::~FlatteningIterator(&local_230);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>
  ::~FlatteningIterator(&IStack_2f8._iter._inn);
  return __return_storage_ptr__;
}

Assistant:

static auto iter(AlascaState& shared, Clause* cl)
    { 
      return shared.selectedSummands(cl, 
                        /* literal*/ SelectionCriterion::NOT_LEQ, 
                        /* term */ SelectionCriterion::NOT_LEQ,
                        /* include number vars */ false)
              .filter([&](auto const& selected) { return selected.isInequality(); })
              .filter([&](auto const& selected) { return selected.sign()   == Sign::Pos; })
              .map([&]   (auto selected)        { return Lhs(std::move(selected));     }); }